

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

int __thiscall ncnn::Log::forward_inplace(Log *this,Mat *bottom_top_blob)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int i_1;
  float *ptr_1;
  int q_1;
  float log_base_inv;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_ffffffffffffff20;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff28;
  int local_b4;
  Mat local_b0;
  Mat *local_80;
  int local_78;
  float local_74;
  int local_70;
  Mat local_60;
  float *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 0x1c);
  local_18 = *(int *)(in_RSI + 0x20);
  local_1c = *(int *)(in_RSI + 0x24);
  local_20 = local_14 * local_18;
  if ((*(float *)(in_RDI + 0x80) != -1.0) || (NAN(*(float *)(in_RDI + 0x80)))) {
    dVar2 = std::log((double)(ulong)*(uint *)(in_RDI + 0x80));
    local_74 = 1.0 / SUB84(dVar2,0);
    for (local_78 = 0; local_78 < local_1c; local_78 = local_78 + 1) {
      this_00 = &local_b0;
      Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff28 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x119f34);
      local_80 = in_stack_ffffffffffffff28;
      for (local_b4 = 0; local_b4 < local_20; local_b4 = local_b4 + 1) {
        dVar2 = std::log((double)(ulong)(uint)(*(float *)(in_RDI + 0x88) +
                                              *(float *)((long)&local_80->data + (long)local_b4 * 4)
                                              * *(float *)(in_RDI + 0x84)));
        *(float *)((long)&local_80->data + (long)local_b4 * 4) = SUB84(dVar2,0) * local_74;
      }
    }
  }
  else {
    for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
      Mat::channel(in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      pfVar1 = Mat::operator_cast_to_float_(&local_60);
      Mat::~Mat((Mat *)0x119e0d);
      local_30 = pfVar1;
      for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
        dVar2 = std::log((double)(ulong)(uint)(*(float *)(in_RDI + 0x88) +
                                              local_30[local_70] * *(float *)(in_RDI + 0x84)));
        local_30[local_70] = SUB84(dVar2,0);
      }
    }
  }
  return 0;
}

Assistant:

int Log::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = log(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        float log_base_inv = 1.f / log(base);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = log(shift + ptr[i] * scale) * log_base_inv;
            }
        }
    }

    return 0;
}